

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void box_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Widget_Type *this;
  bool bVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  void **ppvVar7;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar8;
  uchar uVar9;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar3 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    pvVar6 = (void *)(ulong)current_widget->o->box_;
    pvVar5 = (void *)0x3e8;
    if (pvVar6 != (void *)0x0) {
      pvVar5 = pvVar6;
    }
    ppvVar7 = &boxmenu[0].user_data_;
    for (lVar4 = 0; lVar4 != 0x3d; lVar4 = lVar4 + 1) {
      if (pvVar5 == *ppvVar7) {
        Fl_Choice::value(i,(int)lVar4);
        return;
      }
      ppvVar7 = ppvVar7 + 7;
    }
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar4 = -1;
    }
    else {
      lVar4 = (long)(int)(((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
    }
    iVar3 = (int)boxmenu[lVar4].user_data_;
    if (iVar3 != 0) {
      bVar2 = false;
      uVar9 = (uchar)boxmenu[lVar4].user_data_;
      if (iVar3 == 1000) {
        uVar9 = '\0';
      }
      ppFVar8 = &Fl_Type::first;
      while (this = (Fl_Widget_Type *)*ppFVar8, this != (Fl_Widget_Type *)0x0) {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
          if (iVar3 != 0) {
            this->o->box_ = uVar9;
            Fl_Widget_Type::redraw(this);
            bVar2 = true;
          }
        }
        ppFVar8 = &(this->super_Fl_Type).next;
      }
      if (bVar2) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->box(); if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
        q->o->box((Fl_Boxtype)n);
        q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}